

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::DerivedRedundant::DerivedRedundant
          (DerivedRedundant *this,double e1,double e2,
          vector<double,_std::allocator<double>_> *coefficients,
          vector<int,_std::allocator<int>_> *reactions)

{
  pointer pdVar1;
  pointer pdVar2;
  _Vector_base<double,_std::allocator<double>_> local_38;
  
  pdVar1 = (coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  generateList((vector<double,_std::allocator<double>_> *)&local_38,coefficients,reactions);
  *(long *)&(this->list_).metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>
       = (long)pdVar2 - (long)pdVar1 >> 3;
  ((_Head_base<4UL,_long,_false> *)
  ((long)&(this->list_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long> +
  8))->_M_head_impl =
       (long)local_38._M_impl.super__Vector_impl_data._M_finish -
       (long)local_38._M_impl.super__Vector_impl_data._M_start >> 3;
  ((_Head_base<3UL,_long,_false> *)
  ((long)&(this->list_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long> +
  0x10))->_M_head_impl = 0;
  (this->list_).metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 0
  ;
  (this->list_).metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = e2;
  (this->list_).metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = e1;
  (this->list_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = local_38._M_impl.super__Vector_impl_data._M_start;
  (this->list_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = local_38._M_impl.super__Vector_impl_data._M_finish;
  (this->list_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

DerivedRedundant( double e1, double e2,
                  std::vector< double >&& coefficients,
                  std::vector< int >&& reactions )
try :
  list_(
    ListRecord( e1, e2, 0, 0, coefficients.size(),
                generateList( std::move( coefficients ),
                              std::move( reactions ) ) ) ) {

} catch ( std::exception& e ) {

  Log::info( "Encountered error while constructing DerivedRedundant component" );
  throw;
}